

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O3

char * get_string_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  char *pcVar1;
  size_t sVar2;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (((root != (json_t *)0x0 && should_free != 0) && (root->refcount != 0xffffffffffffffff)) &&
       (sVar2 = root->refcount - 1, root->refcount = sVar2, sVar2 == 0)) {
      json_delete(root);
    }
    *result = 0;
  }
  else {
    if (json->type == JSON_STRING) {
      pcVar1 = json_string_value(json);
      pcVar1 = strdup(pcVar1);
      *result = 1;
      if (root == (json_t *)0x0 || should_free == 0) {
        return pcVar1;
      }
      if (root->refcount == 0xffffffffffffffff) {
        return pcVar1;
      }
      sVar2 = root->refcount - 1;
      root->refcount = sVar2;
      if (sVar2 != 0) {
        return pcVar1;
      }
      json_delete(root);
      return pcVar1;
    }
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be a string\n",option_name);
    if (root == (json_t *)0x0 || should_free == 0) {
      return (char *)0x0;
    }
    if ((root->refcount != 0xffffffffffffffff) &&
       (sVar2 = root->refcount - 1, root->refcount = sVar2, sVar2 == 0)) {
      json_delete(root);
    }
  }
  return (char *)0x0;
}

Assistant:

static char * get_string_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	char * option_value;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return NULL;
	}

	if (!json_is_string(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be a string\n", option_name);
		if (should_free)
			json_decref(root);
		return NULL;
	}

	option_value = strdup(json_string_value(option_item));
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}